

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_buf.cc
# Opt level: O2

ssize_t io_buf::write_file_or_socket(int f,void *buf,size_t nbytes)

{
  ssize_t sVar1;
  
  sVar1 = write(f,buf,nbytes & 0xffffffff);
  return sVar1;
}

Assistant:

ssize_t io_buf::write_file_or_socket(int f, const void* buf, size_t nbytes)
{
#ifdef _WIN32
  if (is_socket(f))
    return send(f, reinterpret_cast<const char*>(buf), static_cast<int>(nbytes), 0);
  else
    return _write(f, buf, (unsigned int)nbytes);
#else
  return write(f, buf, (unsigned int)nbytes);
#endif
}